

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O2

pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *
winmd::reader::parse_array_sizes
          (pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           *__return_storage_ptr__,table_base *param_1,byte_view *data)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  uint32_t size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sizes;
  uint32_t local_4c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  uVar1 = uncompress_unsigned(data);
  uVar2 = uncompress_unsigned(data);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,(ulong)uVar2);
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    local_4c = uncompress_unsigned(data);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_4c);
  }
  __return_storage_ptr__->first = uVar1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&__return_storage_ptr__->second,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<uint32_t, std::vector<uint32_t>> parse_array_sizes(table_base const*, byte_view& data)
    {
        uint32_t const rank = uncompress_unsigned(data);
        uint32_t const num_sizes = uncompress_unsigned(data);
        std::vector<uint32_t> sizes;
        sizes.reserve(num_sizes);
        for (uint32_t i = 0; i < num_sizes; ++i)
        {
            auto size = uncompress_unsigned(data);
            sizes.push_back(size);
        }
        return { rank, sizes };
    }